

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_expr.cpp
# Opt level: O0

ZCC_OpProto * __thiscall
ZCC_OpInfoType::FindBestProto
          (ZCC_OpInfoType *this,PType *left,Conversion **route1,int *numslots1,PType *right,
          Conversion **route2,int *numslots2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int local_180;
  int dist;
  int test_dist2;
  int test_dist1;
  int dist2;
  int dist1;
  ZCC_OpProto *proto;
  ZCC_OpProto *pZStack_160;
  int best_low_dist;
  ZCC_OpProto *best_proto;
  int best_dist2;
  int best_dist1;
  int cur_route2;
  int cur_route1;
  Conversion **best_route2;
  Conversion **best_route1;
  Conversion *routes [2] [2] [8];
  Conversion **route2_local;
  PType *right_local;
  int *numslots1_local;
  Conversion **route1_local;
  PType *left_local;
  ZCC_OpInfoType *this_local;
  
  routes[1][1][7] = (Conversion *)route2;
  if (left == (PType *)0x0 || right == (PType *)0x0) {
    __assert_fail("left != NULL && right != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/zscript/zcc_expr.cpp"
                  ,0xad,
                  "ZCC_OpProto *ZCC_OpInfoType::FindBestProto(PType *, const PType::Conversion **, int &, PType *, const PType::Conversion **, int &)"
                 );
  }
  best_route2 = (Conversion **)0x0;
  _cur_route2 = (Conversion **)0x0;
  best_dist1 = 0;
  best_dist2 = 0;
  best_proto._4_4_ = 0x7fffffff;
  best_proto._0_4_ = 0x7fffffff;
  pZStack_160 = (ZCC_OpProto *)0x0;
  proto._4_4_ = 0x7fffffff;
  for (_dist2 = this->Protos; proto._4_4_ != 0 && _dist2 != (ZCC_OpProto *)0x0;
      _dist2 = _dist2->Next) {
    if (_dist2->Type2 != (PType *)0x0) {
      iVar3 = PType::FindConversion(left,_dist2->Type1,routes[-1][(long)best_dist1 + 1] + 7,8);
      iVar1 = PType::FindConversion(right,_dist2->Type2,routes[0][(long)best_dist2 + 1] + 7,8);
      if ((-1 < iVar3) && (-1 < iVar1)) {
        dist = iVar3;
        if ((0 < iVar3) && (routes[-1][(long)best_dist1 + 1][7]->ConvertConstant == FtoD)) {
          dist = iVar3 + -1;
        }
        local_180 = iVar1;
        if ((0 < iVar1) && (routes[0][(long)best_dist2 + 1][7]->ConvertConstant == FtoD)) {
          local_180 = iVar1 + -1;
        }
        iVar2 = MIN<int>(dist,local_180);
        if (iVar2 < proto._4_4_) {
          pZStack_160 = _dist2;
          best_route2 = routes[-1][(long)best_dist1 + 1] + 7;
          _cur_route2 = routes[0][(long)best_dist2 + 1] + 7;
          best_dist1 = best_dist1 ^ 1;
          best_dist2 = best_dist2 ^ 1;
          proto._4_4_ = iVar2;
          best_proto._0_4_ = iVar1;
          best_proto._4_4_ = iVar3;
        }
      }
    }
  }
  if (((best_route2 != (Conversion **)0x0) && (route1 != (Conversion **)0x0)) && (0 < *numslots1)) {
    iVar3 = MIN<int>(*numslots1,best_proto._4_4_);
    *numslots1 = iVar3;
    if (0 < *numslots1) {
      memcpy(route1,best_route2,(long)*numslots1 << 3);
    }
  }
  if (((_cur_route2 != (Conversion **)0x0) && (routes[1][1][7] != (Conversion *)0x0)) &&
     (0 < *numslots2)) {
    iVar3 = MIN<int>(*numslots2,(int)best_proto);
    *numslots2 = iVar3;
    if (0 < *numslots2) {
      memcpy(routes[1][1][7],_cur_route2,(long)*numslots2 << 3);
    }
  }
  return pZStack_160;
}

Assistant:

ZCC_OpProto *ZCC_OpInfoType::FindBestProto(
	PType *left, const PType::Conversion **route1, int &numslots1,
	PType *right, const PType::Conversion **route2, int &numslots2)
{
	assert(left != NULL && right != NULL);

	const PType::Conversion *routes[2][2][CONVERSION_ROUTE_SIZE];
	const PType::Conversion **best_route1 = NULL, **best_route2 = NULL;
	int cur_route1 = 0, cur_route2 = 0;
	int best_dist1 = INT_MAX, best_dist2 = INT_MAX;

	ZCC_OpProto *best_proto = NULL;
	int best_low_dist = INT_MAX;

	for (ZCC_OpProto *proto = Protos; best_low_dist != 0 && proto != NULL; proto = proto->Next)
	{
		if (proto->Type2 == NULL)
		{ // Not a binary prototype
			continue;
		}
		int dist1 = left->FindConversion(proto->Type1, routes[0][cur_route1], CONVERSION_ROUTE_SIZE);
		int dist2 = right->FindConversion(proto->Type2, routes[1][cur_route2], CONVERSION_ROUTE_SIZE);
		if (dist1 < 0 || dist2 < 0)
		{ // one or both operator types are unreachable
			continue;
		}
		// Do not count F32->F64 conversions in the distance comparisons. If we do, then
		// [[float32 (op) int]] will choose the integer version instead of the floating point
		// version, which we do not want.
		int test_dist1 = dist1, test_dist2 = dist2;
		if (test_dist1 > 0 && routes[0][cur_route1][0]->ConvertConstant == FtoD)
		{
			test_dist1--;
		}
		if (test_dist2 > 0 && routes[1][cur_route2][0]->ConvertConstant == FtoD)
		{
			test_dist2--;
		}
		int dist = MIN(test_dist1, test_dist2);
		if (dist < best_low_dist)
		{
			best_low_dist = dist;
			best_proto = proto;
			best_dist1 = dist1;
			best_dist2 = dist2;
			best_route1 = routes[0][cur_route1];
			best_route2 = routes[1][cur_route2];
			cur_route1 ^= 1;
			cur_route2 ^= 1;
		}
	}
	// Copy best conversion route to the caller's arrays.
	if (best_route1 != NULL && route1 != NULL && numslots1 > 0)
	{
		numslots1 = MIN(numslots1, best_dist1);
		if (numslots1 > 0)
		{
			memcpy(route1, best_route1, sizeof(*route1) * numslots1);
		}
	}
	if (best_route2 != NULL && route2 != NULL && numslots2 > 0)
	{
		numslots2 = MIN(numslots2, best_dist2);
		if (numslots2 > 0)
		{
			memcpy(route2, best_route2, sizeof(*route2) * numslots2);
		}
	}
	return best_proto;
}